

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O1

int run_test_udp_ipv6_only(void)

{
  int iVar1;
  int extraout_EAX;
  uv_udp_t *in_RCX;
  undefined8 *extraout_RDX;
  undefined1 *puVar2;
  uv_udp_t *puVar3;
  uv_udp_send_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_40;
  code *pcStack_38;
  void *local_10;
  void *local_8;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    run_test_udp_ipv6_only_cold_3();
    return 7;
  }
  do_test(ipv6_recv_fail,1);
  local_8 = (void *)(long)recv_cb_called;
  local_10 = (void *)0x0;
  if (local_8 == (void *)0x0) {
    local_8 = (void *)0x1;
    local_10 = (void *)(long)send_cb_called;
    if (local_10 == (void *)0x1) {
      return 0;
    }
  }
  else {
    run_test_udp_ipv6_only_cold_1();
  }
  puVar2 = (undefined1 *)&stack0xfffffffffffffff0;
  run_test_udp_ipv6_only_cold_2();
  pcStack_38 = (code *)0x1d8c73;
  printf("got %d %.*s\n");
  pcStack_38 = (code *)0x1d8c7b;
  puVar3 = in_RCX;
  iVar1 = is_from_client((sockaddr *)in_RCX);
  if ((iVar1 == 0) || ((puVar2 == (undefined1 *)0x0 && (in_RCX == (uv_udp_t *)0x0)))) {
    return iVar1;
  }
  pcStack_38 = alloc_cb;
  ipv6_recv_fail_cold_1();
  pcStack_38 = (code *)(ulong)(puVar3 == (uv_udp_t *)&timeout ||
                              (puVar3 == &client || puVar3 == &server));
  uStack_40 = 0;
  if (pcStack_38 != (code *)0x0) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0xfd7680;
  }
  puVar4 = (uv_udp_send_t *)&stack0xffffffffffffffc8;
  iVar1 = (int)&uStack_40;
  alloc_cb_cold_1();
  if (puVar4 == &req_) {
    if (req_.handle == (uv_udp_t *)&timeout || (req_.handle == &client || req_.handle == &server)) {
      if (iVar1 == 0) {
        send_cb_called = send_cb_called + 1;
        return 0;
      }
      goto LAB_001d8da3;
    }
  }
  else {
    send_cb_cold_1();
  }
  send_cb_cold_3();
LAB_001d8da3:
  send_cb_cold_2();
  uv_close((uv_handle_t *)&server,close_cb);
  uv_close((uv_handle_t *)&client,close_cb);
  uv_close((uv_handle_t *)&timeout,close_cb);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_ipv6_only) {
  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  do_test(ipv6_recv_fail, UV_UDP_IPV6ONLY);

  ASSERT_OK(recv_cb_called);
  ASSERT_EQ(1, send_cb_called);

  return 0;
}